

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,double,hiberlite::stl_stream_adapter<double,std::set<double,std::less<double>,std::allocator<double>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
          *nvp)

{
  AVisitor<hiberlite::UpdateBean> *pAVar1;
  UpdateBean *this_00;
  sqlid_t rowid;
  RowScope *pRVar2;
  string tab;
  sql_nvp<double> el_nvp;
  allocator local_1d2;
  allocator local_1d1;
  AVisitor<hiberlite::UpdateBean> *local_1d0;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  *local_1c8;
  long local_1c0;
  UpdateBean *local_1b8;
  stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
  *local_1b0;
  double *local_1a8;
  shared_res<hiberlite::autoclosed_con> local_1a0;
  shared_connection local_190;
  string local_180 [32];
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  Scope local_c0;
  sql_nvp<double> local_78;
  
  local_1c8 = nvp;
  std::__cxx11::string::string((string *)&local_160,(string *)nvp);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  local_1d0 = av;
  Scope::Scope(&local_c0,&av->scope);
  std::__cxx11::string::string(local_180,(string *)&local_c0);
  local_1b0 = &local_1c8->stream;
  Scope::~Scope(&local_c0);
  local_1c0 = 0;
  local_1b8 = this;
  while ((_Rb_tree_header *)(local_1c8->stream).it._M_node !=
         &(((local_1c8->stream).ct)->_M_t)._M_impl.super__Rb_tree_header) {
    local_1a8 = stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                ::getNext(local_1b0);
    local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_190.res = (local_1d0->rootKey).con.res;
    if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_190.res)->refCount = (local_190.res)->refCount + 1;
    }
    std::__cxx11::string::string((string *)&local_e0,local_180);
    rowid = Database::allocId(&local_190,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_190);
    std::__cxx11::string::string((string *)&local_100,local_180);
    this_00 = local_1b8;
    pRVar2 = curRow(local_1b8);
    startRow(this_00,&local_100,rowid,pRVar2->id,local_1c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string((string *)&local_120,"item",&local_1d1);
    std::__cxx11::string::string((string *)&local_140,"",&local_1d2);
    sql_nvp<double>::sql_nvp((sql_nvp<double> *)&local_c0,&local_120,local_1a8,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    sql_nvp<double>::sql_nvp(&local_78,(sql_nvp<double> *)&local_c0);
    pAVar1 = local_1d0;
    AVisitor<hiberlite::UpdateBean>::operator&(local_1d0,&local_78);
    sql_nvp<double>::~sql_nvp(&local_78);
    local_1a0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_1a0.res = (pAVar1->rootKey).con.res;
    if (local_1a0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_1a0.res)->refCount = (local_1a0.res)->refCount + 1;
    }
    commitRow(local_1b8,&local_1a0,rowid);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1a0);
    local_1c0 = local_1c0 + 1;
    sql_nvp<double>::~sql_nvp((sql_nvp<double> *)&local_c0);
  }
  AVisitor<hiberlite::UpdateBean>::popScope(local_1d0);
  std::__cxx11::string::~string(local_180);
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}